

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

LPCSTR __thiscall Func::GetVtableName(Func *this,INT_PTR address)

{
  int iVar1;
  VtableHashMap *pVVar2;
  char **ppcVar3;
  char *local_28;
  char *local_20;
  LPCSTR name;
  INT_PTR address_local;
  Func *this_local;
  
  name = (LPCSTR)address;
  address_local = (INT_PTR)this;
  if (this->vtableMap == (VtableHashMap *)0x0) {
    pVVar2 = VirtualTableRegistry::CreateVtableHashMap(&this->m_alloc->super_ArenaAllocator);
    this->vtableMap = pVVar2;
  }
  local_28 = (char *)0x0;
  ppcVar3 = JsUtil::
            BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Lookup(this->vtableMap,(long *)&name,&local_28);
  local_20 = *ppcVar3;
  if ((local_20 != (char *)0x0) && (iVar1 = strncmp(local_20,"class ",6), iVar1 == 0)) {
    local_20 = local_20 + 6;
  }
  return local_20;
}

Assistant:

LPCSTR
Func::GetVtableName(INT_PTR address)
{
#if DBG
    if (vtableMap == nullptr)
    {
        vtableMap = VirtualTableRegistry::CreateVtableHashMap(this->m_alloc);
    };
    LPCSTR name = vtableMap->Lookup(address, nullptr);
    if (name)
    {
         if (strncmp(name, "class ", _countof("class ") - 1) == 0)
         {
             name += _countof("class ") - 1;
         }
    }
    return name;
#else
    return "";
#endif
}